

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::setCapacity
          (Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> newBuilder;
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 4)) {
    ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::Maybe<kj::Own<capnp::ClientHook>>>
                           (newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>>::
  addAll<kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>>>
            ((ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>> *)&local_30,&this->builder);
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::operator=(&this->builder,&local_30);
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }